

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

bool __thiscall
docopt::Required::match
          (Required *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  int iVar4;
  pointer psVar5;
  shared_ptr<docopt::Pattern> *pattern;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  c;
  PatternList l;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  local_60;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_48;
  
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(&local_48,left);
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::vector(&local_60,collected);
  psVar1 = (this->super_BranchPattern).fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar3 = (this->super_BranchPattern).fChildren.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    psVar5 = psVar3;
    if (psVar5 == psVar1) {
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      _M_move_assign(left,&local_48);
      std::
      vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
      ::_M_move_assign(collected,&local_60);
      break;
    }
    peVar2 = (psVar5->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar4 = (*peVar2->_vptr_Pattern[2])(peVar2,&local_48,&local_60);
    psVar3 = psVar5 + 1;
  } while ((char)iVar4 != '\0');
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::~vector(&local_60);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector(&local_48);
  return psVar5 == psVar1;
}

Assistant:

bool Required::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
{
	auto l = left;
	auto c = collected;
	
	for(auto const& pattern : fChildren) {
		bool ret = pattern->match(l, c);
		if (!ret) {
			// leave (left, collected) untouched
			return false;
		}
	}
	
	left = std::move(l);
	collected = std::move(c);
	return true;
}